

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcSymProp * __thiscall
CTcParser::def_special_prop(CTcParser *this,int def,char *name,tc_prop_id *idp)

{
  tctarg_prop_id_t tVar1;
  tc_symtype_t tVar2;
  uint *in_RCX;
  CTcSymProp *in_RDX;
  int in_ESI;
  long in_RDI;
  CTcSymbol *sym;
  tctarg_prop_id_t id;
  CTcSymProp *propsym;
  undefined2 in_stack_ffffffffffffff68;
  tctarg_prop_id_t in_stack_ffffffffffffff6a;
  undefined2 in_stack_ffffffffffffff6c;
  undefined2 in_stack_ffffffffffffff6e;
  CTcPrsSymtab *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  CTcSymPropBase *str;
  CTcSymProp *in_stack_ffffffffffffff80;
  CTcSymPropBase *local_28;
  
  if (in_ESI == 0) {
    strlen((char *)in_RDX);
    local_28 = (CTcSymPropBase *)
               CTcPrsSymtab::find(in_stack_ffffffffffffff70,
                                  (textchar_t *)
                                  CONCAT26(in_stack_ffffffffffffff6e,
                                           CONCAT24(in_stack_ffffffffffffff6c,
                                                    CONCAT22(in_stack_ffffffffffffff6a,
                                                             in_stack_ffffffffffffff68))),0x24f33d);
    if ((local_28 == (CTcSymPropBase *)0x0) ||
       (tVar2 = CTcSymbolBase::get_type((CTcSymbolBase *)local_28), tVar2 != TC_SYM_PROP)) {
      local_28 = (CTcSymPropBase *)CTcSymbolBase::operator_new(0x24f36f);
      str = local_28;
      strlen((char *)in_RDX);
      CTcSymProp::CTcSymProp
                (in_RDX,(char *)str,(size_t)local_28,
                 CONCAT22(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c),
                 in_stack_ffffffffffffff6a);
    }
  }
  else {
    CTcGenTarg::new_prop_id(G_cg);
    local_28 = (CTcSymPropBase *)CTcSymbolBase::operator_new(0x24f275);
    strlen((char *)in_RDX);
    CTcSymProp::CTcSymProp
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(size_t)in_stack_ffffffffffffff70
               ,CONCAT22(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c),
               in_stack_ffffffffffffff6a);
    (*(local_28->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
      _vptr_CVmHashEntry[0xf])();
    (**(code **)(**(long **)(in_RDI + 0x80) + 0x18))(*(long **)(in_RDI + 0x80),local_28);
  }
  if (in_RCX != (uint *)0x0) {
    if (local_28 == (CTcSymPropBase *)0x0) {
      tVar1 = 0;
    }
    else {
      tVar1 = CTcSymPropBase::get_prop(local_28);
    }
    *in_RCX = (uint)tVar1;
  }
  return (CTcSymProp *)local_28;
}

Assistant:

CTcSymProp *CTcParser::def_special_prop(int def, const char *name,
                                        tc_prop_id *idp)
{
    /* we haven't created or found the property yet */
    CTcSymProp *propsym = 0;
    
    /* define or look up the property, as required */
    if (def)
    {
        /* allocate the ID */
        tctarg_prop_id_t id = G_cg->new_prop_id();

        /* create the symbol */
        propsym = new CTcSymProp(name, strlen(name), FALSE, id);
        
        /* mark it as referenced, since the compiler itself uses it */
        propsym->mark_referenced();

        /* add it to the global symbol table */
        global_symtab_->add_entry(propsym);
    }
    else
    {
        /* find the entry */
        CTcSymbol *sym = global_symtab_->find(name, strlen(name));

        /* check to see if we found a property symbol */
        if (sym != 0 && sym->get_type() == TC_SYM_PROP)
        {
            /* got it - use the definition we found */
            propsym = (CTcSymProp *)sym;
        }
        else
        {
            /* not found - create a dummy symbol for it */
            propsym = new CTcSymProp(name, strlen(name), FALSE,
                                     TCTARG_INVALID_PROP);
        }
    }

    /* hand the property ID back to the caller if they want it */
    if (idp != 0)
        *idp = (propsym != 0 ? propsym->get_prop() : TCTARG_INVALID_PROP);

    /* return the symbol */
    return propsym;
}